

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O0

Precision * __thiscall
icu_63::number::IncrementPrecision::withMinFraction
          (Precision *__return_storage_ptr__,IncrementPrecision *this,int32_t minFrac)

{
  undefined4 uVar1;
  Precision local_38;
  int32_t local_14;
  IncrementPrecision *pIStack_10;
  int32_t minFrac_local;
  IncrementPrecision *this_local;
  
  if ((this->super_Precision).fType == RND_ERROR) {
    uVar1 = *(undefined4 *)&(this->super_Precision).field_0x4;
    __return_storage_ptr__->fType = (this->super_Precision).fType;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar1;
    (__return_storage_ptr__->fUnion).fracSig = (this->super_Precision).fUnion.fracSig;
    *(undefined8 *)((long)&__return_storage_ptr__->fUnion + 8) =
         *(undefined8 *)((long)&(this->super_Precision).fUnion + 8);
    uVar1 = *(undefined4 *)&(this->super_Precision).field_0x1c;
    __return_storage_ptr__->fRoundingMode = (this->super_Precision).fRoundingMode;
    *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar1;
  }
  else {
    local_14 = minFrac;
    pIStack_10 = this;
    if ((minFrac < 0) || (999 < minFrac)) {
      number::Precision::Precision(__return_storage_ptr__,U_NUMBER_ARG_OUTOFBOUNDS_ERROR);
    }
    else {
      number::Precision::constructIncrement
                ((IncrementPrecision *)&local_38,(this->super_Precision).fUnion.increment.fIncrement
                 ,minFrac);
      __return_storage_ptr__->fType = local_38.fType;
      *(undefined4 *)&__return_storage_ptr__->field_0x4 = local_38._4_4_;
      (__return_storage_ptr__->fUnion).fracSig = local_38.fUnion.fracSig;
      *(undefined8 *)((long)&__return_storage_ptr__->fUnion + 8) = local_38.fUnion._8_8_;
      __return_storage_ptr__->fRoundingMode = local_38.fRoundingMode;
      *(undefined4 *)&__return_storage_ptr__->field_0x1c = local_38._28_4_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Precision IncrementPrecision::withMinFraction(int32_t minFrac) const {
    if (fType == RND_ERROR) { return *this; } // no-op in error state
    if (minFrac >= 0 && minFrac <= kMaxIntFracSig) {
        return constructIncrement(fUnion.increment.fIncrement, minFrac);
    } else {
        return {U_NUMBER_ARG_OUTOFBOUNDS_ERROR};
    }
}